

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O3

void __thiscall
QByteArrayMatcher::QByteArrayMatcher(QByteArrayMatcher *this,char *pattern,qsizetype length)

{
  long lVar1;
  char cVar2;
  int __c;
  size_t sVar3;
  
  (this->q_pattern).d.ptr = (char *)0x0;
  (this->q_pattern).d.size = 0;
  this->d = (QByteArrayMatcherPrivate *)0x0;
  (this->q_pattern).d.d = (Data *)0x0;
  (this->field_2).p.p = (uchar *)pattern;
  if (length < 0) {
    if (pattern == (char *)0x0) {
      length = 0;
    }
    else {
      length = strlen(pattern);
    }
  }
  (this->field_2).p.l = length;
  sVar3 = 0xff;
  if (length < 0xff) {
    sVar3 = length;
  }
  __c = (int)sVar3;
  memset(&this->field_2,__c,0x100);
  if (__c != 0) {
    cVar2 = (char)sVar3;
    lVar1 = 0;
    do {
      cVar2 = cVar2 + -1;
      *(char *)((long)&this->field_2 + (ulong)(byte)pattern[lVar1 + (length - __c)]) = cVar2;
      lVar1 = lVar1 + 1;
    } while ((int)lVar1 != __c);
  }
  return;
}

Assistant:

QByteArrayMatcher::QByteArrayMatcher(const char *pattern, qsizetype length) : d(nullptr)
{
    p.p = reinterpret_cast<const uchar *>(pattern);
    if (length < 0)
        p.l = qstrlen(pattern);
    else
        p.l = length;
    bm_init_skiptable(p.p, p.l, p.q_skiptable);
}